

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O1

string * __thiscall
FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair>,std::less<boost::shared_ptr<PartialJPDPValuePair>>>
::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  ostream *poVar2;
  long *plVar3;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  plVar3 = *this;
  if (plVar3 != (long *)this) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"FixedCapacityPriorityQueue item number ",0x27);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      (**(code **)(*(long *)plVar3[2] + 0x78))(&local_1e0);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1e0,local_1d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)this);
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string SoftPrint() const
        {
            std::stringstream ss;
            size_t i=0;
            typename std::list<T>::const_iterator it = _m_l.begin();
            while(it!=_m_l.end())
            {
                ss << "FixedCapacityPriorityQueue item number " << i << std::endl;
                ss << (*it)->SoftPrint() << std::endl;
                it++;
                i++;
            }
            return(ss.str());
        }